

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::skippedStringLong(XMLReader *this,XMLCh *toSkip)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  ulong uVar5;
  XMLSize_t XVar6;
  
  XVar3 = XMLString::stringLen(toSkip);
  XVar6 = this->fCharIndex;
  uVar5 = this->fCharsAvail - XVar6;
  do {
    if (XVar3 == 0) {
      return true;
    }
    while ((uVar5 < XVar3 && (uVar5 != 0x4000))) {
      bVar1 = refreshCharBuffer(this);
      if (!bVar1) {
        return false;
      }
      XVar6 = this->fCharIndex;
      uVar4 = this->fCharsAvail - XVar6;
      bVar1 = uVar4 == uVar5;
      uVar5 = uVar4;
      if (bVar1) {
        return false;
      }
    }
    uVar4 = XVar3;
    if (uVar5 < XVar3) {
      uVar4 = uVar5;
    }
    iVar2 = bcmp(this->fCharBuf + XVar6,toSkip,uVar4 * 2);
    if (iVar2 != 0) {
      return XVar3 == 0;
    }
    toSkip = toSkip + uVar4;
    XVar3 = XVar3 - uVar4;
    XVar6 = XVar6 + uVar4;
    this->fCharIndex = XVar6;
    this->fCurCol = this->fCurCol + uVar4;
    uVar5 = uVar5 - uVar4;
  } while( true );
}

Assistant:

bool XMLReader::skippedStringLong(const XMLCh* toSkip)
{
    // This function works on strings that are potentially longer than
    // kCharBufSize (e.g., end tag). This function does not guarantee
    // that in case the comparison is unsuccessful the fCharIndex will
    // point to the original data.
    //

    XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    while (srcLen != 0)
    {
      // Fill up the buffer with as much data as possible.
      //
      while (charsLeft < srcLen && charsLeft != kCharBufSize)
      {
        if (!refreshCharBuffer())
          return false;

        XMLSize_t tmp = charsLeftInBuffer();
        if (tmp == charsLeft) // if the refreshCharBuf() did not add anything
          return false;       // new give up and return.

        charsLeft = tmp;
      }

      XMLSize_t n = charsLeft < srcLen ? charsLeft : srcLen;

      if (memcmp(&fCharBuf[fCharIndex], toSkip, n * sizeof(XMLCh)))
        return false;

      toSkip += n;
      srcLen -= n;

      fCharIndex += n;
      fCurCol += (XMLFileLoc)n;
      charsLeft -= n;
    }

    return true;
}